

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O0

int dorecover_fd(int infd)

{
  __off_t __offset;
  long initial_pos;
  memfile mf;
  int ret;
  int infd_local;
  
  mnew((memfile *)&initial_pos,(memfile *)0x0);
  restoring = '\x01';
  __offset = lseek(infd,0,1);
  initial_pos = (long)loadfile(infd,(int *)&mf);
  if ((char *)initial_pos == (char *)0x0) {
    ret = 0;
  }
  else {
    mf.tags[0x3f0]._4_4_ = dorecover((memfile *)&initial_pos);
    mfree((memfile *)&initial_pos);
    if (mf.tags[0x3f0]._4_4_ != 0) {
      lseek(infd,__offset,0);
      ftruncate(infd,__offset);
    }
    ret = mf.tags[0x3f0]._4_4_;
  }
  return ret;
}

Assistant:

int dorecover_fd(int infd)
{
	int ret;
	struct memfile mf;
	long initial_pos;

	mnew(&mf, NULL);

	restoring = TRUE;

	initial_pos = lseek(infd, 0, SEEK_CUR);
	mf.buf = loadfile(infd, &mf.len);
	if (!mf.buf)
	    return 0;
	
	ret = dorecover(&mf);
	mfree(&mf);
	
	if (ret) {
	    /* erase the binary portion of the logfile */
	    lseek(infd, initial_pos, SEEK_SET);
	    ftruncate(infd, initial_pos);
	}
	
	return ret;
}